

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int server_handle_certificate(ptls_t *tls,ptls_iovec_t message)

{
  int local_2c;
  int ret;
  int got_certs;
  ptls_t *tls_local;
  ptls_iovec_t message_local;
  
  message_local.base = (uint8_t *)message.len;
  tls_local = (ptls_t *)message.base;
  _ret = tls;
  message_local.len._4_4_ =
       handle_certificate(tls,(uint8_t *)((long)&tls_local->ctx + 4),
                          message_local.base + (long)(&tls_local->traffic_protection + -1) + 0x58,
                          &local_2c);
  if (message_local.len._4_4_ == 0) {
    if (local_2c == 0) {
      message_local.len._4_4_ = 0x74;
    }
    else {
      ptls__key_schedule_update_hash
                (_ret->key_schedule,(uint8_t *)tls_local,(size_t)message_local.base);
      _ret->state = PTLS_STATE_SERVER_EXPECT_CERTIFICATE_VERIFY;
      message_local.len._4_4_ = 0x202;
    }
  }
  return message_local.len._4_4_;
}

Assistant:

static int server_handle_certificate(ptls_t *tls, ptls_iovec_t message)
{
    int got_certs, ret;

    if ((ret = handle_certificate(tls, message.base + PTLS_HANDSHAKE_HEADER_SIZE, message.base + message.len, &got_certs)) != 0)
        return ret;
    if (!got_certs)
        return PTLS_ALERT_CERTIFICATE_REQUIRED;

    ptls__key_schedule_update_hash(tls->key_schedule, message.base, message.len);

    tls->state = PTLS_STATE_SERVER_EXPECT_CERTIFICATE_VERIFY;
    return PTLS_ERROR_IN_PROGRESS;
}